

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack27_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7ffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1b;
  *puVar1 = (in[1] & 0x3fffff) << 5 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x16;
  *puVar1 = (in[2] & 0x1ffff) << 10 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x11;
  *puVar1 = (in[3] & 0xfff) << 0xf | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0xc;
  *puVar1 = (in[4] & 0x7f) << 0x14 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 7;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 3) << 0x19 | *puVar1;
  out[6] = *puVar2 >> 2 & 0x7ffffff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1d;
  *puVar1 = (in[6] & 0xffffff) << 3 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[6] >> 0x18;
  *puVar1 = (in[7] & 0x7ffff) << 8 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[7] >> 0x13;
  *puVar1 = (in[8] & 0x3fff) << 0xd | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[8] >> 0xe;
  *puVar1 = (in[9] & 0x1ff) << 0x12 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[9] >> 9;
  puVar2 = in + 10;
  *puVar1 = (*puVar2 & 0xf) << 0x17 | *puVar1;
  out[0xc] = *puVar2 >> 4 & 0x7ffffff;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[0xb] & 0x3ffffff) << 1 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xb] >> 0x1a;
  *puVar1 = (in[0xc] & 0x1fffff) << 6 | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0xc] >> 0x15;
  *puVar1 = (in[0xd] & 0xffff) << 0xb | *puVar1;
  return in + 0xe;
}

Assistant:

const uint32_t *__fastunpack27_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 19)) << (27 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 14)) << (27 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 9)) << (27 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 4)) << (27 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 27);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 26)) << (27 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 21)) << (27 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 16)) << (27 - 16);
  out++;

  return in + 1;
}